

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::verifyFloatMax
               (ResultCollector *result,QueriedState *state,float maxValue)

{
  ostream *poVar1;
  float fVar2;
  ostringstream buf;
  string local_1c8;
  float local_1a4;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if (0.0 <= maxValue) {
      return;
    }
    if ((state->m_v).vBool != false) {
      return;
    }
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"expected GL_TRUE, got GL_FALSE","");
    tcu::ResultCollector::fail(result,local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p == &local_1a0[0].field_2) {
      return;
    }
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    return;
  case DATATYPE_INTEGER:
    fVar2 = floorf(maxValue + 0.5);
    if ((state->m_v).vInt <= (int)fVar2) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Expected less or equal to ",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,(int)fVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c8);
    break;
  case DATATYPE_INTEGER64:
    fVar2 = floorf(maxValue + 0.5);
    if ((state->m_v).vInt64 <= (long)fVar2) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Expected less or equal to ",0x1a);
    poVar1 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c8);
    break;
  case DATATYPE_FLOAT:
    if (((state->m_v).vFloat <= maxValue) && (!NAN((state->m_v).vFloat))) {
      return;
    }
    local_1a4 = maxValue;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Expected less or equal to ",0x1a);
    poVar1 = std::ostream::_M_insert<double>((double)local_1a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<double>((double)(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1c8);
    break;
  default:
    goto switchD_0182e402_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
switchD_0182e402_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}